

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall duckdb::Connection::~Connection(Connection *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ClientContext *pCVar1;
  type pDVar2;
  type this_01;
  type context;
  
  if ((this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
    pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&pCVar1->db);
    this_01 = unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>,_true>
              ::operator*(&pDVar2->connection_manager);
    context = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    ConnectionManager::RemoveConnection(this_01,context);
  }
  this_00 = (this->context).internal.
            super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

Connection::~Connection() {
	if (!context) {
		return;
	}
	ConnectionManager::Get(*context->db).RemoveConnection(*context);
}